

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtzobj.cpp
# Opt level: O1

CVmTimeZone * CVmObjTimeZone::parse_ctor_args(vm_val_t *argp,int argc)

{
  CVmTimeZoneCache *this;
  int iVar1;
  int32_t gmtofs_secs;
  ushort *puVar2;
  CVmTimeZone *pCVar3;
  
  if (argc < 1) {
    pCVar3 = CVmTimeZoneCache::get_local_zone(G_tzcache_X);
  }
  else {
    if (argc != 1) {
      err_throw(0x899);
    }
    puVar2 = (ushort *)vm_val_t::get_as_string(argp);
    if (puVar2 == (ushort *)0x0) {
      if ((argp->typ != VM_INT) && (iVar1 = vm_val_t::nonint_is_numeric(argp), iVar1 == 0)) {
        err_throw(0x900);
      }
      this = G_tzcache_X;
      if (argp->typ == VM_INT) {
        gmtofs_secs = (argp->val).intval;
      }
      else {
        gmtofs_secs = vm_val_t::nonint_num_to_int(argp);
      }
      pCVar3 = CVmTimeZoneCache::get_gmtofs_zone(this,gmtofs_secs);
    }
    else {
      pCVar3 = CVmTimeZoneCache::parse_zone(G_tzcache_X,(char *)(puVar2 + 1),(ulong)*puVar2);
    }
  }
  if (pCVar3 == (CVmTimeZone *)0x0) {
    err_throw(0x902);
  }
  return pCVar3;
}

Assistant:

CVmTimeZone *CVmObjTimeZone::parse_ctor_args(
    VMG_ const vm_val_t *argp, int argc)
{
    /* check arguments */
    const char *str;
    CVmTimeZone *tz = 0;
    if (argc <= 0)
    {
        /* no arguments; create a local timezone object */
        tz = G_tzcache->get_local_zone(vmg0_);
    }
    else if (argc == 1 && (str = argp->get_as_string(vmg0_)) != 0)
    {
        /* get the string buffer and length */
        size_t len = vmb_get_len(str);
        str += VMB_LEN;

        /* parse the zone name */
        tz = G_tzcache->parse_zone(vmg_ str, len);
    }
    else if (argc == 1 && argp->is_numeric(vmg0_))
    {
        /* construct from a gmt offset */
        tz = G_tzcache->get_gmtofs_zone(vmg_ argp->num_to_int(vmg0_));
    }
    else if (argc > 1)
    {
        /* wrong number of arguments */
        err_throw(VMERR_WRONG_NUM_OF_ARGS);
    }
    else
    {
        /* wrong type */
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* if we didn't find a zone, it's an error */
    if (tz == 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* return the zone */
    return tz;
}